

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_iCCP(ucvector *out,LodePNGInfo *info,LodePNGCompressSettings *zlibsettings)

{
  uchar *in;
  long in_RSI;
  size_t size;
  size_t keysize;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  uint error;
  LodePNGCompressSettings *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  ucvector *out_00;
  uchar **out_01;
  uint local_24;
  uint local_4;
  
  out_01 = (uchar **)0x0;
  out_00 = (ucvector *)0x0;
  in = (uchar *)lodepng_strlen(*(char **)(in_RSI + 0xf0));
  if ((in == (uchar *)0x0) || ((uchar *)0x4f < in)) {
    local_4 = 0x59;
  }
  else {
    local_24 = zlib_compress(out_01,(size_t *)out_00,in,(size_t)in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
    if (local_24 == 0) {
      in_stack_ffffffffffffffb0 = in + 2 + (long)out_00;
      local_24 = lodepng_chunk_init(out_01,out_00,(uint)((ulong)in >> 0x20),
                                    (char *)in_stack_ffffffffffffffb0);
    }
    if (local_24 == 0) {
      lodepng_memcpy((void *)0x8,*(void **)(in_RSI + 0xf0),(size_t)in);
      in[8] = '\0';
      in[9] = '\0';
      lodepng_memcpy(in + 10,out_01,(size_t)out_00);
      lodepng_chunk_generate_crc(in_stack_ffffffffffffffb0);
    }
    lodepng_free((void *)0x16b280);
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_iCCP(ucvector* out, const LodePNGInfo* info, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t keysize = lodepng_strlen(info->iccp_name);

  if (keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  error = zlib_compress(&compressed, &compressedsize,
    info->iccp_profile, info->iccp_profile_size, zlibsettings);
  if (!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "iCCP");
  }
  if (!error) {
    lodepng_memcpy(chunk + 8, info->iccp_name, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}